

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.cpp
# Opt level: O0

fd_t zmq::open_socket(int domain_,int type_,int protocol_)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  int in_EDX;
  uint in_ESI;
  int in_EDI;
  char *errstr;
  fd_t s;
  int rc;
  int local_4;
  
  local_4 = ::socket(in_EDI,in_ESI | 0x80000,in_EDX);
  if (local_4 == -1) {
    local_4 = -1;
  }
  else {
    make_socket_noninheritable(local_4);
    iVar1 = set_nosigpipe(local_4);
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/ip.cpp"
              ,0x7c);
      fflush(_stderr);
      zmq_abort((char *)0x1e4440);
    }
  }
  return local_4;
}

Assistant:

zmq::fd_t zmq::open_socket (int domain_, int type_, int protocol_)
{
    int rc;

    //  Setting this option result in sane behaviour when exec() functions
    //  are used. Old sockets are closed and don't block TCP ports etc.
#if defined ZMQ_HAVE_SOCK_CLOEXEC
    type_ |= SOCK_CLOEXEC;
#endif

#if defined ZMQ_HAVE_WINDOWS && defined WSA_FLAG_NO_HANDLE_INHERIT
    // if supported, create socket with WSA_FLAG_NO_HANDLE_INHERIT, such that
    // the race condition in making it non-inheritable later is avoided
    const fd_t s = WSASocket (domain_, type_, protocol_, NULL, 0,
                              WSA_FLAG_OVERLAPPED | WSA_FLAG_NO_HANDLE_INHERIT);
#else
    const fd_t s = socket (domain_, type_, protocol_);
#endif
    if (s == retired_fd) {
#ifdef ZMQ_HAVE_WINDOWS
        errno = wsa_error_to_errno (WSAGetLastError ());
#endif
        return retired_fd;
    }

    make_socket_noninheritable (s);

    //  Socket is not yet connected so EINVAL is not a valid networking error
    rc = zmq::set_nosigpipe (s);
    errno_assert (rc == 0);

    return s;
}